

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O1

int __thiscall ncnn::Crop_x86::forward(Crop_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  void *pvVar7;
  size_t sVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined4 uVar24;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined1 uVar31;
  undefined8 uVar32;
  int iVar39;
  long lVar40;
  int iVar41;
  uint uVar42;
  Allocator *pAVar43;
  int iVar44;
  Allocator *pAVar45;
  long lVar46;
  bool bVar47;
  bool bVar48;
  Mat local_178;
  int _outw;
  int local_120;
  int local_11c;
  int _outh;
  int _woffset;
  Option *local_110;
  int _outc;
  int _outd;
  int _hoffset;
  Mat m;
  int _coffset;
  Mat m_1;
  int _doffset;
  undefined4 uVar18;
  undefined3 uVar20;
  undefined2 uVar22;
  undefined4 uVar26;
  undefined3 uVar28;
  undefined2 uVar30;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined3 uVar35;
  undefined1 uVar36;
  undefined2 uVar37;
  undefined1 uVar38;
  
  iVar44 = bottom_blob->elempack;
  if (iVar44 != 4) goto LAB_001bfb79;
  local_120 = bottom_blob->w;
  iVar1 = bottom_blob->h;
  iVar2 = bottom_blob->d;
  iVar3 = bottom_blob->c;
  iVar4 = bottom_blob->dims;
  if (iVar4 - 1U < 4) {
    lVar40 = (long)local_120;
    local_178.w = local_120;
    switch(iVar4) {
    case 1:
      local_178.w = local_120 * 4;
      local_178.dims = 1;
      local_178.h = 1;
      local_178.d = 1;
      local_178.c = 1;
      local_178.cstep = (size_t)local_178.w;
      goto LAB_001beaf1;
    case 2:
      local_178.h = iVar1 * 4;
      local_178.elemsize._0_4_ = 4;
      local_178.elempack = 1;
      local_178.dims = 2;
      local_178.d = 1;
      local_178.c = 1;
      local_178.cstep = local_178.h * lVar40;
      goto LAB_001beb70;
    case 3:
      local_178.dims = 3;
      local_178.d = 1;
      lVar40 = iVar1 * lVar40;
      break;
    case 4:
      local_178.dims = 4;
      lVar40 = iVar1 * lVar40 * (long)iVar2;
      local_178.d = iVar2;
    }
    local_178.c = iVar3 * 4;
    local_178.cstep = lVar40 + 3U & 0x3ffffffffffffffc;
    local_178.h = iVar1;
LAB_001beaf1:
    local_178.elemsize._0_4_ = 4;
    local_178.elempack = 1;
  }
  else {
    local_178.cstep = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elempack = 0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
  }
LAB_001beb70:
  local_178.elemsize._4_4_ = 0;
  local_178.refcount._4_4_ = 0;
  local_178.refcount._0_4_ = 0;
  local_178.allocator = (Allocator *)0x0;
  local_178.data = (void *)0x0;
  uVar5 = bottom_blob->elemsize;
  pAVar43 = (Allocator *)&_doffset;
  local_11c = iVar44;
  local_110 = opt;
  Crop::resolve_crop_roi
            ((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),&local_178,
             &_woffset,&_hoffset,(int *)pAVar43,&_coffset,&_outw,&_outh,&_outd,&_outc);
  piVar6 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  iVar41 = iVar3;
  if (iVar4 == 1) {
    uVar42 = _outw & 3;
    iVar44 = (uint)(uVar42 == 0) * 3 + 1;
    if (_outw / iVar44 == local_120 && uVar42 == 0) {
      if (top_blob != bottom_blob) {
        piVar6 = bottom_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = top_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pvVar7 = top_blob->data;
            pAVar45 = top_blob->allocator;
            if (pAVar45 == (Allocator *)0x0) {
              if (pvVar7 != (void *)0x0) {
                free(pvVar7);
              }
            }
            else {
              (*pAVar45->_vptr_Allocator[3])(pAVar45,pvVar7,(long)_outw % (long)iVar44 & 0xffffffff)
              ;
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar6 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar6;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar44 = bottom_blob->w;
        iVar41 = bottom_blob->h;
        iVar39 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar44;
        top_blob->h = iVar41;
        top_blob->d = iVar39;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
      }
LAB_001bed59:
      bVar47 = false;
      iVar41 = 0;
    }
    else if (((_outw | _woffset) & 3U) == 0) {
      pAVar43 = local_110->blob_allocator;
      Mat::create(top_blob,_outw / iVar44,(uVar5 >> 2) << (uVar42 == 0) * '\x02',iVar44,pAVar43);
      iVar41 = -100;
      if (top_blob->data == (void *)0x0) {
        bVar47 = false;
      }
      else {
        bVar47 = false;
        if ((long)top_blob->c * top_blob->cstep != 0) {
          iVar44 = _woffset + 3;
          if (-1 < _woffset) {
            iVar44 = _woffset;
          }
          crop_pack4_sse(bottom_blob,top_blob,0,iVar44 >> 2);
          goto LAB_001bed59;
        }
      }
    }
    else {
      bVar47 = true;
    }
    if (bVar47) goto LAB_001bed6b;
LAB_001bef91:
    bVar47 = false;
    opt = local_110;
    goto LAB_001bfb64;
  }
LAB_001bed6b:
  if (iVar4 == 2) {
    bVar47 = (_outh & 3U) == 0;
    iVar44 = (uint)bVar47 * 3 + 1;
    pAVar43 = (Allocator *)0x0;
    if (_outw == local_120) {
      if (((_outh & 3U) != 0) || (_outh / iVar44 != iVar1)) goto LAB_001bedf3;
      if (top_blob != bottom_blob) {
        piVar6 = bottom_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = top_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pvVar7 = top_blob->data;
            pAVar45 = top_blob->allocator;
            if (pAVar45 == (Allocator *)0x0) {
              if (pvVar7 != (void *)0x0) {
                free(pvVar7);
              }
            }
            else {
              (*pAVar45->_vptr_Allocator[3])(pAVar45,pvVar7,(long)_outh % (long)iVar44 & 0xffffffff)
              ;
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar6 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar6;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar44 = bottom_blob->w;
        iVar41 = bottom_blob->h;
        iVar39 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar44;
        top_blob->h = iVar41;
        top_blob->d = iVar39;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
      }
LAB_001beecd:
      bVar9 = false;
      iVar41 = 0;
    }
    else {
LAB_001bedf3:
      bVar9 = true;
      if (((_hoffset | _outh) & 3U) == 0) {
        Mat::create(top_blob,_outw,_outh / iVar44,(uVar5 >> 2) << bVar47 * '\x02',iVar44,
                    local_110->blob_allocator);
        iVar41 = -100;
        if (top_blob->data == (void *)0x0) {
          bVar9 = false;
        }
        else {
          bVar9 = false;
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar44 = _hoffset + 3;
            if (-1 < _hoffset) {
              iVar44 = _hoffset;
            }
            crop_pack4_sse(bottom_blob,top_blob,iVar44 >> 2,_woffset);
            goto LAB_001beecd;
          }
        }
      }
    }
    if (!bVar9) goto LAB_001bef91;
  }
  opt = local_110;
  if (iVar4 == 3) {
    bVar47 = (_outc & 3U) == 0;
    iVar44 = (uint)bVar47 * 3 + 1;
    pAVar45 = (Allocator *)((uVar5 >> 2) << bVar47 * '\x02');
    bVar47 = _outh == iVar1;
    bVar9 = _outw == local_120;
    pAVar43 = (Allocator *)CONCAT71((int7)((ulong)pAVar43 >> 8),bVar47 && bVar9);
    if (bVar47 && bVar9) {
      if (((_outc & 3U) != 0) || (_outc / iVar44 != iVar3)) goto LAB_001bef98;
      if (top_blob != bottom_blob) {
        piVar6 = bottom_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = top_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pvVar7 = top_blob->data;
            pAVar45 = top_blob->allocator;
            if (pAVar45 == (Allocator *)0x0) {
              if (pvVar7 != (void *)0x0) {
                free(pvVar7);
              }
            }
            else {
              (*pAVar45->_vptr_Allocator[3])(pAVar45,pvVar7,(long)_outc % (long)iVar44 & 0xffffffff)
              ;
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar6 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar6;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar44 = bottom_blob->w;
        iVar41 = bottom_blob->h;
        iVar39 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar44;
        top_blob->h = iVar41;
        top_blob->d = iVar39;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
      }
      bVar10 = false;
      iVar41 = 0;
    }
    else {
LAB_001bef98:
      bVar10 = true;
      if (((_coffset | _outc) & 3U) == 0) {
        local_178.c = _outc / iVar44;
        local_178.w = bottom_blob->w;
        local_178.h = bottom_blob->h;
        if (bottom_blob->dims == 3) {
          local_178.cstep = bottom_blob->elemsize;
          local_178.data =
               (void *)((long)(_coffset / iVar44) * bottom_blob->cstep * local_178.cstep +
                       (long)bottom_blob->data);
          local_178.elempack = bottom_blob->elempack;
          local_178.allocator = bottom_blob->allocator;
          local_178.elemsize._0_4_ = (undefined4)local_178.cstep;
          local_178.elemsize._4_4_ = (undefined4)(local_178.cstep >> 0x20);
          local_178.dims = 3;
          local_178.d = 1;
          lVar40 = (long)local_178.h * (long)local_178.w * local_178.cstep;
        }
        else {
          local_178.cstep = bottom_blob->elemsize;
          local_178.data =
               (void *)((long)(_coffset / iVar44) * bottom_blob->cstep * local_178.cstep +
                       (long)bottom_blob->data);
          local_178.d = bottom_blob->d;
          local_178.elempack = bottom_blob->elempack;
          local_178.allocator = bottom_blob->allocator;
          local_178.elemsize._0_4_ = (undefined4)local_178.cstep;
          local_178.elemsize._4_4_ = (undefined4)(local_178.cstep >> 0x20);
          local_178.dims = 4;
          lVar40 = (long)local_178.h * (long)local_178.w * (long)local_178.d * local_178.cstep;
        }
        local_178.refcount._4_4_ = 0;
        local_178.refcount._0_4_ = 0;
        local_178.cstep = (lVar40 + 0xfU & 0xfffffffffffffff0) / local_178.cstep;
        if (bVar47 && bVar9) {
          Mat::clone(&m,(__fn *)&local_178,(void *)0x0,local_178.c,pAVar43);
          if (&m != top_blob) {
            piVar6 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + 1;
              UNLOCK();
            }
            piVar6 = top_blob->refcount;
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = m.data;
            top_blob->refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
            top_blob->elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
            top_blob->elempack = m.elempack;
            top_blob->allocator = m.allocator;
            top_blob->dims = m.dims;
            top_blob->w = m.w;
            top_blob->h = m.h;
            top_blob->d = m.d;
            top_blob->c = m.c;
            top_blob->cstep = m.cstep;
          }
          piVar6 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          iVar41 = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
          goto LAB_001bf253;
        }
        else {
LAB_001bf253:
          Mat::create(top_blob,_outw,_outh,_outc / iVar44,(size_t)pAVar45,iVar44,opt->blob_allocator
                     );
          iVar41 = -100;
          pAVar43 = pAVar45;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            if (0 < top_blob->c) {
              lVar40 = 0;
              do {
                if (local_178.dims == 3) {
                  lVar46 = local_178.cstep * lVar40 *
                           CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
                  m.dims = 2;
                  m.c = 1;
                }
                else {
                  lVar46 = local_178.cstep * lVar40 *
                           CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
                  m.dims = 3;
                  m.c = local_178.d;
                }
                m.data = (void *)(lVar46 + (long)local_178.data);
                m.d = 1;
                m.w = local_178.w;
                m.allocator = local_178.allocator;
                m.elempack = local_178.elempack;
                m.elemsize._4_4_ = local_178.elemsize._4_4_;
                m.elemsize._0_4_ = (undefined4)local_178.elemsize;
                m.refcount._4_4_ = 0;
                m.refcount._0_4_ = 0;
                m.h = local_178.h;
                m.cstep = (long)local_178.h * (long)local_178.w;
                if (top_blob->dims == 3) {
                  iVar44 = top_blob->w;
                  sVar8 = top_blob->elemsize;
                  m_1.data = (void *)(top_blob->cstep * lVar40 * sVar8 + (long)top_blob->data);
                  m_1.h = top_blob->h;
                  m_1.elempack = top_blob->elempack;
                  pAVar45 = top_blob->allocator;
                  m_1.elemsize._0_4_ = (undefined4)sVar8;
                  m_1.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
                  m_1.w = iVar44;
                  m_1.dims = 2;
                  m_1.c = 1;
                  m_1.allocator = pAVar45;
                }
                else {
                  iVar44 = top_blob->w;
                  m_1.h = top_blob->h;
                  m_1.c = top_blob->d;
                  sVar8 = top_blob->elemsize;
                  m_1.data = (void *)(top_blob->cstep * lVar40 * sVar8 + (long)top_blob->data);
                  m_1.elempack = top_blob->elempack;
                  pAVar45 = (Allocator *)(ulong)(uint)m_1.elempack;
                  m_1.allocator = top_blob->allocator;
                  m_1.elemsize._0_4_ = (undefined4)sVar8;
                  m_1.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
                  m_1.w = iVar44;
                  m_1.dims = 3;
                }
                m_1.d = 1;
                m_1.refcount._4_4_ = 0;
                m_1.refcount._0_4_ = 0;
                m_1.cstep = (long)m_1.h * (long)iVar44;
                crop_pack4_sse(&m,&m_1,_hoffset,_woffset);
                piVar6 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + -1;
                  UNLOCK();
                  if (*piVar6 == 0) {
                    if (m_1.allocator == (Allocator *)0x0) {
                      if (m_1.data != (void *)0x0) {
                        free(m_1.data);
                      }
                    }
                    else {
                      (*(m_1.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                m_1.cstep = 0;
                m_1.data = (void *)0x0;
                m_1.refcount._0_4_ = 0;
                m_1.refcount._4_4_ = 0;
                m_1.elemsize._0_4_ = 0;
                m_1.elemsize._4_4_ = 0;
                m_1.elempack = 0;
                m_1.dims = 0;
                m_1.w = 0;
                m_1.h = 0;
                m_1.d = 0;
                m_1.c = 0;
                piVar6 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + -1;
                  UNLOCK();
                  if (*piVar6 == 0) {
                    if (m.allocator == (Allocator *)0x0) {
                      if (m.data != (void *)0x0) {
                        free(m.data);
                      }
                    }
                    else {
                      (*(m.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                m.cstep = 0;
                m.data = (void *)0x0;
                m.refcount._0_4_ = 0;
                m.refcount._4_4_ = 0;
                m.elemsize._0_4_ = 0;
                m.elemsize._4_4_ = 0;
                m.elempack = 0;
                m.dims = 0;
                m.w = 0;
                m.h = 0;
                m.d = 0;
                m.c = 0;
                lVar40 = lVar40 + 1;
              } while (lVar40 < top_blob->c);
            }
            iVar41 = 0;
            pAVar43 = pAVar45;
          }
        }
        piVar6 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_178.allocator == (Allocator *)0x0) {
              if (local_178.data != (void *)0x0) {
                free(local_178.data);
              }
            }
            else {
              (*(local_178.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        bVar10 = false;
      }
    }
    if (bVar10) goto LAB_001bf637;
LAB_001bfb62:
    bVar47 = false;
  }
  else {
LAB_001bf637:
    opt = local_110;
    bVar47 = true;
    if (iVar4 == 4) {
      bVar48 = (_outc & 3U) == 0;
      iVar44 = (uint)bVar48 * 3 + 1;
      bVar9 = iVar2 == _outd;
      bVar10 = iVar1 == _outh;
      bVar11 = local_120 == _outw;
      if (bVar9 && (bVar10 && bVar11)) {
        if (((_outc & 3U) == 0) && (_outc / iVar44 == iVar3)) {
          if (top_blob != bottom_blob) {
            piVar6 = bottom_blob->refcount;
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + 1;
              UNLOCK();
            }
            piVar6 = top_blob->refcount;
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                pvVar7 = top_blob->data;
                pAVar43 = top_blob->allocator;
                if (pAVar43 == (Allocator *)0x0) {
                  if (pvVar7 != (void *)0x0) {
                    free(pvVar7);
                  }
                }
                else {
                  (*pAVar43->_vptr_Allocator[3])
                            (pAVar43,pvVar7,(long)_outc % (long)iVar44 & 0xffffffff);
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            piVar6 = bottom_blob->refcount;
            top_blob->data = bottom_blob->data;
            top_blob->refcount = piVar6;
            top_blob->elemsize = bottom_blob->elemsize;
            top_blob->elempack = bottom_blob->elempack;
            top_blob->allocator = bottom_blob->allocator;
            iVar44 = bottom_blob->w;
            iVar1 = bottom_blob->h;
            iVar2 = bottom_blob->d;
            top_blob->dims = bottom_blob->dims;
            top_blob->w = iVar44;
            top_blob->h = iVar1;
            top_blob->d = iVar2;
            top_blob->c = bottom_blob->c;
            top_blob->cstep = bottom_blob->cstep;
          }
          iVar41 = 0;
          bVar47 = false;
          goto LAB_001bfb64;
        }
      }
      bVar47 = true;
      if (((_coffset | _outc) & 3U) == 0) {
        local_178.c = _outc / iVar44;
        local_178.w = bottom_blob->w;
        local_178.h = bottom_blob->h;
        if (bottom_blob->dims == 3) {
          local_178.cstep = bottom_blob->elemsize;
          local_178.data =
               (void *)((long)(_coffset / iVar44) * bottom_blob->cstep * local_178.cstep +
                       (long)bottom_blob->data);
          local_178.elempack = bottom_blob->elempack;
          local_178.allocator = bottom_blob->allocator;
          local_178.elemsize._0_4_ = (undefined4)local_178.cstep;
          local_178.elemsize._4_4_ = (undefined4)(local_178.cstep >> 0x20);
          local_178.dims = 3;
          local_178.d = 1;
          lVar40 = (long)local_178.h * (long)local_178.w * local_178.cstep;
        }
        else {
          local_178.cstep = bottom_blob->elemsize;
          local_178.data =
               (void *)((long)(_coffset / iVar44) * bottom_blob->cstep * local_178.cstep +
                       (long)bottom_blob->data);
          local_178.d = bottom_blob->d;
          local_178.elempack = bottom_blob->elempack;
          local_178.allocator = bottom_blob->allocator;
          local_178.elemsize._0_4_ = (undefined4)local_178.cstep;
          local_178.elemsize._4_4_ = (undefined4)(local_178.cstep >> 0x20);
          local_178.dims = 4;
          lVar40 = (long)local_178.h * (long)local_178.w * (long)local_178.d * local_178.cstep;
        }
        local_178.refcount._4_4_ = 0;
        local_178.refcount._0_4_ = 0;
        local_178.cstep = (lVar40 + 0xfU & 0xfffffffffffffff0) / local_178.cstep;
        if (bVar9 && (bVar10 && bVar11)) {
          Mat::clone(&m,(__fn *)&local_178,(void *)0x0,local_178.c,
                     (void *)CONCAT71((int7)((ulong)pAVar43 >> 8),bVar9 && (bVar10 && bVar11)));
          Mat::operator=(top_blob,&m);
          Mat::~Mat(&m);
          iVar41 = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
          goto LAB_001bf862;
        }
        else {
LAB_001bf862:
          Mat::create(top_blob,_outw,_outh,_outd,_outc / iVar44,(uVar5 >> 2) << bVar48 * '\x02',
                      iVar44,opt->blob_allocator);
          iVar41 = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            if (top_blob->c < 1) {
              iVar41 = 0;
            }
            else {
              lVar40 = 0;
              do {
                if (0 < _outd) {
                  lVar46 = 0;
                  do {
                    m.cstep = (long)local_178.h * (long)local_178.w;
                    m.data = (void *)((long)local_178.data +
                                     (long)(_doffset + (int)lVar46) *
                                     CONCAT44(local_178.elemsize._4_4_,
                                              (undefined4)local_178.elemsize) * m.cstep +
                                     local_178.cstep * lVar40 *
                                     CONCAT44(local_178.elemsize._4_4_,
                                              (undefined4)local_178.elemsize));
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)local_178.elemsize;
                    m.elemsize._4_4_ = local_178.elemsize._4_4_;
                    m.elempack = local_178.elempack;
                    m.allocator = local_178.allocator;
                    m.w = local_178.w;
                    m.dims = 2;
                    m.h = local_178.h;
                    m.d = 1;
                    m.c = 1;
                    sVar8 = top_blob->elemsize;
                    m_1.elempack = top_blob->elempack;
                    m_1.allocator = top_blob->allocator;
                    m_1.h = top_blob->h;
                    m_1.cstep = (long)m_1.h * (long)top_blob->w;
                    m_1.data = (void *)((long)top_blob->data +
                                       lVar46 * sVar8 * m_1.cstep + top_blob->cstep * lVar40 * sVar8
                                       );
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = (undefined4)sVar8;
                    m_1.elemsize._4_4_ = (undefined4)(sVar8 >> 0x20);
                    m_1.w = top_blob->w;
                    m_1.dims = 2;
                    m_1.d = 1;
                    m_1.c = 1;
                    crop_pack4_sse(&m,&m_1,_hoffset,_woffset);
                    piVar6 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                    if (piVar6 != (int *)0x0) {
                      LOCK();
                      *piVar6 = *piVar6 + -1;
                      UNLOCK();
                      if (*piVar6 == 0) {
                        if (m_1.allocator == (Allocator *)0x0) {
                          if (m_1.data != (void *)0x0) {
                            free(m_1.data);
                          }
                        }
                        else {
                          (*(m_1.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m_1.cstep = 0;
                    m_1.data = (void *)0x0;
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = 0;
                    m_1.elemsize._4_4_ = 0;
                    m_1.elempack = 0;
                    m_1.dims = 0;
                    m_1.w = 0;
                    m_1.h = 0;
                    m_1.d = 0;
                    m_1.c = 0;
                    piVar6 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar6 != (int *)0x0) {
                      LOCK();
                      *piVar6 = *piVar6 + -1;
                      UNLOCK();
                      if (*piVar6 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m.cstep = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = 0;
                    m.elemsize._4_4_ = 0;
                    m.elempack = 0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    lVar46 = lVar46 + 1;
                  } while (lVar46 < _outd);
                }
                lVar40 = lVar40 + 1;
              } while (lVar40 < top_blob->c);
              iVar41 = 0;
              opt = local_110;
            }
          }
        }
        piVar6 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_178.allocator == (Allocator *)0x0) {
              if (local_178.data != (void *)0x0) {
                free(local_178.data);
              }
            }
            else {
              (*(local_178.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_001bfb62;
      }
    }
  }
LAB_001bfb64:
  iVar44 = local_11c;
  if (!bVar47) {
    return iVar41;
  }
LAB_001bfb79:
  local_178.data = bottom_blob->data;
  piVar6 = bottom_blob->refcount;
  local_178.refcount._0_4_ = SUB84(piVar6,0);
  local_178.refcount._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
  local_178.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  local_178.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_178.elempack = bottom_blob->elempack;
  local_178.allocator = bottom_blob->allocator;
  uVar12 = bottom_blob->dims;
  uVar13 = bottom_blob->w;
  uVar14 = bottom_blob->h;
  uVar15 = bottom_blob->d;
  local_178.c = bottom_blob->c;
  local_178.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  local_178.dims = uVar12;
  local_178.w = uVar13;
  local_178.h = uVar14;
  local_178.d = uVar15;
  if (iVar44 != 1) {
    m.data = *(void **)opt;
    uVar16 = opt->openmp_blocktime;
    uVar17 = opt->use_winograd_convolution;
    uVar19 = opt->use_sgemm_convolution;
    uVar21 = opt->use_int8_inference;
    uVar23 = opt->use_vulkan_compute;
    uVar22 = CONCAT11(uVar23,uVar21);
    uVar20 = CONCAT21(uVar22,uVar19);
    uVar18 = CONCAT31(uVar20,uVar17);
    m.allocator = *(Allocator **)&opt->use_bf16_storage;
    m._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    uVar24 = opt->flush_denormals;
    uVar25 = opt->use_local_pool_allocator;
    uVar27 = opt->use_reserved_1;
    uVar29 = opt->use_reserved_2;
    uVar31 = opt->use_reserved_3;
    uVar30 = CONCAT11(uVar31,uVar29);
    uVar28 = CONCAT21(uVar30,uVar27);
    uVar26 = CONCAT31(uVar28,uVar25);
    uVar32._0_1_ = opt->use_reserved_4;
    uVar32._1_1_ = opt->use_reserved_5;
    uVar32._2_1_ = opt->use_reserved_6;
    uVar32._3_1_ = opt->use_reserved_7;
    uVar33 = opt->use_reserved_8;
    uVar34 = opt->use_reserved_9;
    uVar36 = opt->use_reserved_10;
    uVar38 = opt->use_reserved_11;
    uVar37 = CONCAT11(uVar38,uVar36);
    uVar35 = CONCAT21(uVar37,uVar34);
    uVar32._4_4_ = CONCAT31(uVar35,uVar33);
    m.c = (int)uVar32;
    m.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    m.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    m.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    m.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    m.elempack = uVar16;
    m._28_4_ = uVar18;
    m.h = uVar24;
    m.d = uVar26;
    m._60_4_ = uVar32._4_4_;
    convert_packing(bottom_blob,&local_178,1,(Option *)&m);
  }
  iVar44 = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),
                         &local_178,top_blob,opt);
  piVar6 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar44;
}

Assistant:

int Crop_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
#if __AVX__
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
#if __AVX__
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}